

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agentI,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *actions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *observations)

{
  uint aI;
  int iVar1;
  Index IVar2;
  const_reference this_00;
  const_reference pvVar3;
  undefined4 extraout_var;
  size_t nrO;
  const_reference pvVar4;
  Index ts;
  size_type __n;
  PlanningUnitMADPDiscrete *this_01;
  ulong __n_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> AO_Is;
  allocator_type local_61;
  Index local_60;
  Index local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  value_type_conflict1 local_4c;
  _func_int **local_48;
  
  local_58 = observations;
  this_00 = std::
            vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ::at(&this->_m_firstAOHIforT,(ulong)agentI);
  __n_00 = (ulong)t;
  local_5c = t;
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at(this_00,__n_00);
  local_60 = Globals::CastLIndexToIndex(*pvVar3);
  iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
  nrO = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
  this_01 = (PlanningUnitMADPDiscrete *)&stack0xffffffffffffffb8;
  local_4c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,__n_00,&local_4c,
             &local_61);
  for (__n = 0; __n_00 != __n; __n = __n + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(actions,__n);
    aI = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_58,__n);
    this_01 = (PlanningUnitMADPDiscrete *)(ulong)aI;
    IVar2 = IndexTools::ActionAndObservation_to_ActionObservationIndex
                      (aI,*pvVar4,CONCAT44(extraout_var,iVar1),nrO);
    *(Index *)((long)local_48 + __n * 4) = IVar2;
  }
  IVar2 = ComputeHistoryIndex(this_01,local_5c,local_60,(Index *)local_48,
                              nrO * CONCAT44(extraout_var,iVar1));
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffb8);
  return IVar2;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex(
        Index agentI, 
        Index t, 
        const vector<Index>& actions,
        const vector<Index>& observations
        ) const
{
    //functioning is the same as for observation histories: only now the 
    //base is the nr AO.

    //-> first convert to AO indices:
    size_t first_AOHI=CastLIndexToIndex(_m_firstAOHIforT.at(agentI).at(t));
    size_t nrA = GetNrActions(agentI);
    size_t nrO = GetNrObservations(agentI);
    size_t nrAO = nrA * nrO;
    vector<Index> AO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        AO_Is[ts] =  IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    actions.at(ts), observations.at(ts), nrA, nrO);
    return( ComputeHistoryIndex(
                t, 
                first_AOHI,
                &AO_Is[0],
                nrAO
                )
          );    

    /*for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrAO, (double)(exponent));
        Index this_t_ao = IndexTools::
            ActionAndObservation_to_ActionObservationIndex(
                    actions.at(ts), observations.at(ts), nrA, nrO);
        this_AOHI += this_t_ao * b;
    }
    return(this_AOHI);*/
}